

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O3

int __thiscall
QTableViewPrivate::nextActiveVisualRow
          (QTableViewPrivate *this,int rowToStart,int column,int limit,
          SearchDirection searchDirection)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int visualIndex;
  long in_FS_OFFSET;
  QModelIndex local_68;
  undefined1 local_50 [24];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = QHeaderView::logicalIndex(this->horizontalHeader,column);
  iVar4 = rowToStart;
  if (searchDirection == Increasing) {
    if (rowToStart < limit) {
      visualIndex = rowToStart;
      do {
        iVar4 = QHeaderView::logicalIndex(this->verticalHeader,visualIndex);
        bVar2 = QHeaderView::isSectionHidden(this->verticalHeader,iVar4);
        if (!bVar2) {
          pQVar1 = (this->super_QAbstractItemViewPrivate).model;
          QPersistentModelIndex::operator_cast_to_QModelIndex
                    (&local_68,&(this->super_QAbstractItemViewPrivate).root);
          (**(code **)(*(long *)pQVar1 + 0x60))(local_50,pQVar1,iVar4,iVar3,&local_68);
          pQVar1 = (this->super_QAbstractItemViewPrivate).model;
          uVar5 = (**(code **)(*(long *)pQVar1 + 0x138))(pQVar1,local_50);
          iVar4 = visualIndex;
          if ((uVar5 & 0x20) != 0) break;
        }
        visualIndex = visualIndex + 1;
        iVar4 = rowToStart;
      } while (limit != visualIndex);
    }
  }
  else if ((searchDirection == Decreasing) && (limit < rowToStart)) {
    do {
      iVar4 = QHeaderView::logicalIndex(this->verticalHeader,rowToStart);
      bVar2 = QHeaderView::isSectionHidden(this->verticalHeader,iVar4);
      if (!bVar2) {
        pQVar1 = (this->super_QAbstractItemViewPrivate).model;
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  (&local_68,&(this->super_QAbstractItemViewPrivate).root);
        (**(code **)(*(long *)pQVar1 + 0x60))(local_50,pQVar1,iVar4,iVar3,&local_68);
        pQVar1 = (this->super_QAbstractItemViewPrivate).model;
        uVar5 = (**(code **)(*(long *)pQVar1 + 0x138))(pQVar1,local_50);
        iVar4 = rowToStart;
        if ((uVar5 & 0x20) != 0) break;
      }
      rowToStart = rowToStart + -1;
      iVar4 = limit;
    } while (limit < rowToStart);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

int QTableViewPrivate::nextActiveVisualRow(int rowToStart, int column, int limit,
                                           SearchDirection searchDirection) const
{
    const int lc = logicalColumn(column);
    int visualRow = rowToStart;
    const auto isCellActive = [this](int vr, int lc)
    {
        const int lr = logicalRow(vr);
        return !isRowHidden(lr) && isCellEnabled(lr, lc);
    };
    switch (searchDirection) {
    case SearchDirection::Increasing:
        if (visualRow < limit) {
            while (!isCellActive(visualRow, lc)) {
                if (++visualRow == limit)
                    return rowToStart;
            }
        }
        break;
    case SearchDirection::Decreasing:
        while (visualRow > limit && !isCellActive(visualRow, lc))
            --visualRow;
        break;
    }
    return visualRow;
}